

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::CompressPiz
               (uchar *outPtr,uint *outSize,uchar *inPtr,size_t inSize,
               vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *channelInfo,
               int data_width,int num_lines)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  unsigned_short *puVar7;
  void *in_RDX;
  int *in_RSI;
  ushort *in_RDI;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int length;
  int zero;
  char *lengthPtr;
  int j;
  PIZChannelData *cd_2;
  size_t i_1;
  char *buf;
  unsigned_short maxValue;
  unsigned_short lut [65536];
  int n;
  PIZChannelData *cd_1;
  size_t i;
  int y;
  uchar *ptr;
  int pixelSize;
  PIZChannelData *cd;
  size_t c;
  unsigned_short *tmpBufferEnd;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  uchar bitmap [8192];
  char *in_stack_0005dea8;
  int in_stack_0005deb4;
  unsigned_short *in_stack_0005deb8;
  undefined4 in_stack_fffffffffffdde78;
  undefined4 in_stack_fffffffffffdde7c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffdde80;
  allocator_type *in_stack_fffffffffffdde90;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> *this;
  size_type in_stack_fffffffffffdde98;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
  *in_stack_fffffffffffddea0;
  undefined8 in_stack_fffffffffffddef8;
  int in_stack_fffffffffffddf00;
  unsigned_short *puVar8;
  unsigned_short *in;
  ushort *puStack_220e8;
  unsigned_short auStack_220d8 [65544];
  ulong local_20c8;
  int local_20bc;
  void *local_20b8;
  int local_20ac;
  ulong local_20a0;
  reference local_2098;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_2088 [2];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_2058;
  ushort local_203c;
  ushort local_203a;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> local_2038 [341];
  int local_2c;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *local_28;
  void *local_18;
  int *local_10;
  ushort *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x157300);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffddea0,
             in_stack_fffffffffffdde98,(allocator_type *)in_stack_fffffffffffdde90);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x157326);
  std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::size(local_28);
  std::allocator<tinyexr::PIZChannelData>::allocator((allocator<tinyexr::PIZChannelData> *)0x15734a)
  ;
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
            (in_stack_fffffffffffddea0,in_stack_fffffffffffdde98,in_stack_fffffffffffdde90);
  std::allocator<tinyexr::PIZChannelData>::~allocator
            ((allocator<tinyexr::PIZChannelData> *)0x157370);
  local_2098 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                         (in_stack_fffffffffffdde80,
                          CONCAT44(in_stack_fffffffffffdde7c,in_stack_fffffffffffdde78));
  local_20a0 = 0;
  while( true ) {
    sVar3 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                      (local_2088);
    if (sVar3 <= local_20a0) break;
    pvVar4 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
             operator[](local_2088,local_20a0);
    pvVar4->start = local_2098;
    pvVar4->end = pvVar4->start;
    pvVar4->nx = local_2c;
    pvVar4->ny = in_stack_00000008;
    local_20ac = 4;
    pvVar5 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (local_28,local_20a0);
    if (pvVar5->pixel_type == 1) {
      local_20ac = 2;
    }
    pvVar4->size = (int)((ulong)(long)local_20ac >> 1);
    local_2098 = local_2098 + pvVar4->nx * pvVar4->ny * pvVar4->size;
    local_20a0 = local_20a0 + 1;
  }
  local_20b8 = local_18;
  for (local_20bc = 0; local_20bc < in_stack_00000008; local_20bc = local_20bc + 1) {
    local_20c8 = 0;
    while( true ) {
      sVar3 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                        (local_2088);
      if (sVar3 <= local_20c8) break;
      pvVar4 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
               operator[](local_2088,local_20c8);
      iVar1 = pvVar4->nx * pvVar4->size;
      memcpy(pvVar4->end,local_20b8,(long)iVar1 << 1);
      local_20b8 = (void *)((long)iVar1 * 2 + (long)local_20b8);
      pvVar4->end = pvVar4->end + iVar1;
      local_20c8 = local_20c8 + 1;
    }
  }
  pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                     (in_stack_fffffffffffdde80,
                      CONCAT44(in_stack_fffffffffffdde7c,in_stack_fffffffffffdde78));
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_2058);
  this = local_2038;
  bitmapFromData(pvVar6,(int)sVar3,(uchar *)this,&local_203a,&local_203c);
  puVar8 = auStack_220d8;
  forwardLutFromBitmap((uchar *)this,puVar8);
  pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                     (in_stack_fffffffffffdde80,
                      CONCAT44(in_stack_fffffffffffdde7c,in_stack_fffffffffffdde78));
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_2058);
  applyLut(puVar8,pvVar6,(int)sVar3);
  *local_8 = local_203a;
  local_8[1] = local_203c;
  puStack_220e8 = local_8 + 2;
  if (local_203a <= local_203c) {
    memcpy(puStack_220e8,
           (void *)((long)&local_2038[0].
                           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)(int)(uint)local_203a),
           (long)(int)(((uint)local_203c - (uint)local_203a) + 1));
    puStack_220e8 =
         (ushort *)((long)puStack_220e8 + (long)(int)(((uint)local_203c - (uint)local_203a) + 1));
  }
  puVar8 = (unsigned_short *)0x0;
  while( true ) {
    in = puVar8;
    puVar7 = (unsigned_short *)
             std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::size
                       (local_2088);
    if (puVar7 <= puVar8) break;
    pvVar4 = std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
             operator[](local_2088,(size_type)in);
    for (iVar1 = 0; iVar1 < pvVar4->size; iVar1 = iVar1 + 1) {
      wav2Encode(in,(int)((ulong)pvVar4 >> 0x20),(int)pvVar4,iVar1,in_stack_fffffffffffddf00,
                 (unsigned_short)((ulong)in_stack_fffffffffffddef8 >> 0x30));
    }
    puVar8 = (unsigned_short *)((long)in + 1);
  }
  puStack_220e8[0] = 0;
  puStack_220e8[1] = 0;
  iVar1 = (int)puStack_220e8;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
            (in_stack_fffffffffffdde80,CONCAT44(in_stack_fffffffffffdde7c,in_stack_fffffffffffdde78)
            );
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_2058);
  iVar2 = hufCompress(in_stack_0005deb8,in_stack_0005deb4,in_stack_0005dea8);
  *(int *)puStack_220e8 = iVar2;
  *local_10 = ((iVar1 + 4) - (int)local_8) + iVar2;
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::~vector(this);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this);
  return true;
}

Assistant:

bool CompressPiz(unsigned char *outPtr, unsigned int &outSize,
                 const unsigned char *inPtr, size_t inSize,
                 const std::vector<ChannelInfo> &channelInfo, int data_width,
                 int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  // Assume `inSize` is multiple of 2 or 4.
  std::vector<unsigned short> tmpBuffer(inSize / sizeof(unsigned short));

  std::vector<PIZChannelData> channelData(channelInfo.size());
  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t c = 0; c < channelData.size(); c++) {
    PIZChannelData &cd = channelData[c];

    cd.start = tmpBufferEnd;
    cd.end = cd.start;

    cd.nx = data_width;
    cd.ny = num_lines;
    // cd.ys = c.channel().ySampling;

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (channelInfo[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    cd.size = pixelSize / sizeof(short);

    tmpBufferEnd += cd.nx * cd.ny * cd.size;
  }

  const unsigned char *ptr = inPtr;
  for (int y = 0; y < num_lines; ++y) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(cd.end, ptr, n * sizeof(unsigned short));
      ptr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  bitmapFromData(&tmpBuffer.at(0), tmpBuffer.size(), bitmap, minNonZero,
                 maxNonZero);

  unsigned short lut[USHORT_RANGE];
  unsigned short maxValue = forwardLutFromBitmap(bitmap, lut);
  applyLut(lut, &tmpBuffer.at(0), tmpBuffer.size());

  //
  // Store range compression info in _outBuffer
  //

  char *buf = reinterpret_cast<char *>(outPtr);

  memcpy(buf, &minNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);
  memcpy(buf, &maxNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);

  if (minNonZero <= maxNonZero) {
    memcpy(buf, (char *)&bitmap[0] + minNonZero, maxNonZero - minNonZero + 1);
    buf += maxNonZero - minNonZero + 1;
  }

  //
  // Apply wavelet encoding
  //

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Encode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Apply Huffman encoding; append the result to _outBuffer
  //

  // length header(4byte), then huff data. Initialize length header with zero,
  // then later fill it by `length`.
  char *lengthPtr = buf;
  int zero = 0;
  memcpy(buf, &zero, sizeof(int));
  buf += sizeof(int);

  int length = hufCompress(&tmpBuffer.at(0), tmpBuffer.size(), buf);
  memcpy(lengthPtr, &length, sizeof(int));

  outSize = (reinterpret_cast<unsigned char *>(buf) - outPtr) + length;
  return true;
}